

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

quadratic_cost_type<long_double> * __thiscall
baryonyx::itm::normalize_costs<long_double,baryonyx::itm::quadratic_cost_type<long_double>>
          (quadratic_cost_type<long_double> *__return_storage_ptr__,itm *this,context *ctx,
          quadratic_cost_type<long_double> *c,random_engine *rng,int n)

{
  int n_00;
  
  n_00 = (int)rng;
  quadratic_cost_type<long_double>::quadratic_cost_type
            (__return_storage_ptr__,(quadratic_cost_type<long_double> *)ctx,n_00);
  switch(*(undefined4 *)(this + 0xd8)) {
  case 0:
    info<>((context *)this,"  - No norm");
    break;
  case 1:
    info<>((context *)this,"  - Compute random norm\n");
    quadratic_cost_type<long_double>::
    make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
              (__return_storage_ptr__,n_00,
               (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)c);
    break;
  case 2:
    info<>((context *)this,"  - Compute l1 norm\n");
    quadratic_cost_type<long_double>::make_l1_norm(__return_storage_ptr__,n_00);
    break;
  case 3:
    info<>((context *)this,"  - Compute l2 norm\n");
    quadratic_cost_type<long_double>::make_l2_norm(__return_storage_ptr__,n_00);
    break;
  default:
    info<>((context *)this,"  - Compute infinity-norm (default)\n");
    quadratic_cost_type<long_double>::make_loo_norm(__return_storage_ptr__,n_00);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Cost
normalize_costs(const context& ctx, const Cost& c, random_engine& rng, int n)
{
    Cost ret(c, n);

    switch (ctx.parameters.cost_norm) {
    case solver_parameters::cost_norm_type::none:
        info(ctx, "  - No norm");
        return ret;

    case solver_parameters::cost_norm_type::random:
        info(ctx, "  - Compute random norm\n");
        ret.make_random_norm(n, rng);
        return ret;

    case solver_parameters::cost_norm_type::l1:
        info(ctx, "  - Compute l1 norm\n");
        ret.make_l1_norm(n);
        return ret;

    case solver_parameters::cost_norm_type::l2:
        info(ctx, "  - Compute l2 norm\n");
        ret.make_l2_norm(n);
        return ret;

    default:
        info(ctx, "  - Compute infinity-norm (default)\n");
        ret.make_loo_norm(n);
        return ret;
    }
}